

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O1

bool __thiscall SymbolTable::isTempName(SymbolTable *this,string *name,string *curFun)

{
  pointer pvVar1;
  pointer pSVar2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  mapped_type *pmVar5;
  SymbolTableElement *i;
  pointer pSVar6;
  bool bVar7;
  
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->funToName,curFun);
  pvVar1 = (this->symbolTable).
           super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = pvVar1[*pmVar5].
           super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = *(pointer *)
            ((long)&pvVar1[*pmVar5].
                    super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                    _M_impl.super__Vector_impl_data + 8);
  bVar7 = pSVar6 != pSVar2;
  if (bVar7) {
    sVar3 = name->_M_string_length;
    do {
      __n = (pSVar6->name)._M_string_length;
      if ((__n == sVar3) &&
         (((__n == 0 ||
           (iVar4 = bcmp((pSVar6->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n), iVar4 == 0))
          && (pSVar6->isTemp != false)))) {
        return bVar7;
      }
      pSVar6 = pSVar6 + 1;
      bVar7 = pSVar6 != pSVar2;
    } while (bVar7);
  }
  return bVar7;
}

Assistant:

bool SymbolTable::isTempName(string name, string curFun) {
    int index = funToName[curFun];
    for (auto &i : symbolTable[index]) {
        if(i.name == name && i.isTemp) {
            return true;
        }
    }
//    cout << "未找到该变量" << endl;
    return false;
}